

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodemap_out.cc
# Opt level: O0

void rcg::printNode(string *prefix,INode *node,int depth,bool show_enum_list)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  EAccessMode AccessMode;
  int *piVar6;
  void *this;
  undefined8 *puVar7;
  ulong uVar8;
  long lVar9;
  long *plVar10;
  ostream *poVar11;
  ostream *str;
  char *pcVar12;
  undefined1 in_CL;
  int in_EDX;
  string *in_RSI;
  string *in_RDI;
  double dVar13;
  size_t i_2;
  StringList_t list;
  IEnumeration *p_5;
  size_t i_1;
  FeatureList_t feature;
  ICategory *root;
  int i;
  uint8_t buffer [32];
  int len;
  IRegister *p_4;
  IString *p_3;
  IFloat *p_2;
  IBoolean *p_1;
  IInteger *p;
  INode *in_stack_fffffffffffff588;
  IBase *in_stack_fffffffffffff590;
  gcstring *in_stack_fffffffffffff5a8;
  ostream *in_stack_fffffffffffff5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5b8;
  long *local_9e8;
  long *local_980;
  long *local_8c0;
  long *local_898;
  int64_t in_stack_fffffffffffff7b0;
  IInteger *in_stack_fffffffffffff7b8;
  long *local_820;
  long *local_798;
  long *local_6f0;
  ostream local_648 [80];
  gcstring local_5f8 [80];
  gcstring local_5a8 [80];
  ulong local_558;
  gcstring_vector local_550 [16];
  long *local_540;
  gcstring local_538 [80];
  string local_4e8 [32];
  ulong local_4c8;
  value_vector local_4c0 [16];
  long *local_4b0;
  gcstring local_4a8 [80];
  int local_458;
  char local_451;
  int local_450;
  int local_44c;
  byte local_448 [32];
  gcstring local_428 [84];
  int local_3d4;
  long *local_3d0;
  gcstring local_3c8 [80];
  long *local_378;
  gcstring local_370 [80];
  gcstring local_320 [80];
  long *local_2d0;
  gcstring local_2c8 [80];
  gcstring local_278 [80];
  long *local_228;
  gcstring local_220 [80];
  gcstring local_1d0 [80];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  long *local_120;
  gcstring local_118 [80];
  gcstring local_c8 [96];
  gcstring local_68 [75];
  undefined1 in_stack_ffffffffffffffe3;
  int in_stack_ffffffffffffffe4;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar14;
  
  uVar14 = CONCAT13(in_CL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  if ((in_RSI != (string *)0x0) &&
     (iVar4 = (*(code *)**(undefined8 **)(in_RSI + *(long *)(*(long *)in_RSI + -0x28)))
                        (in_RSI + *(long *)(*(long *)in_RSI + -0x28)), iVar4 != 0)) {
    uVar5 = (**(code **)(*(long *)in_RSI + 0xf0))();
    switch(uVar5) {
    case 0:
      poVar11 = std::operator<<((ostream *)&std::cout,in_RDI);
      std::operator<<(poVar11,"Value: ");
      (**(code **)(*(long *)in_RSI + 0x18))(local_68,in_RSI,0);
      poVar11 = operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      poVar11 = std::operator<<(poVar11," ");
      pcVar12 = anon_unknown_2::getAccessMode(in_stack_fffffffffffff588);
      poVar11 = std::operator<<(poVar11,pcVar12);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      GenICam_3_4::gcstring::~gcstring(local_68);
      break;
    case 1:
      poVar11 = std::operator<<((ostream *)&std::cout,in_RDI);
      std::operator<<(poVar11,"Base: ");
      (**(code **)(*(long *)in_RSI + 0x18))(local_c8,in_RSI,0);
      poVar11 = operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      poVar11 = std::operator<<(poVar11," ");
      pcVar12 = anon_unknown_2::getAccessMode(in_stack_fffffffffffff588);
      poVar11 = std::operator<<(poVar11,pcVar12);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      GenICam_3_4::gcstring::~gcstring(local_c8);
      break;
    case 2:
      poVar11 = std::operator<<((ostream *)&std::cout,in_RDI);
      std::operator<<(poVar11,"Integer: ");
      (**(code **)(*(long *)in_RSI + 0x18))(local_118,in_RSI,0);
      poVar11 = operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      poVar11 = std::operator<<(poVar11," ");
      pcVar12 = anon_unknown_2::getAccessMode(in_stack_fffffffffffff588);
      poVar11 = std::operator<<(poVar11,pcVar12);
      std::operator<<(poVar11," ");
      GenICam_3_4::gcstring::~gcstring(local_118);
      if (in_RSI == (string *)0x0) {
        local_6f0 = (long *)0x0;
      }
      else {
        local_6f0 = (long *)__dynamic_cast(in_RSI,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
      }
      local_120 = local_6f0;
      bVar3 = GenApi_3_4::IsReadable(in_stack_fffffffffffff590);
      if (bVar3) {
        poVar11 = std::operator<<((ostream *)&std::cout,"[");
        (**(code **)(*local_120 + 0x60))();
        formatValue_abi_cxx11_(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
        poVar11 = std::operator<<(poVar11,local_140);
        poVar11 = std::operator<<(poVar11,", ");
        (**(code **)(*local_120 + 0x68))();
        formatValue_abi_cxx11_(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
        poVar11 = std::operator<<(poVar11,local_160);
        std::operator<<(poVar11,"]: ");
        std::__cxx11::string::~string(local_160);
        std::__cxx11::string::~string(local_140);
        (**(code **)(*local_120 + 0x48))(local_120,0);
        formatValue_abi_cxx11_(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
        poVar11 = std::operator<<((ostream *)&std::cout,local_180);
        std::operator<<(poVar11," ");
        (**(code **)(*local_120 + 0x90))(local_1d0);
        operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
        GenICam_3_4::gcstring::~gcstring(local_1d0);
        std::__cxx11::string::~string(local_180);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      break;
    case 3:
      poVar11 = std::operator<<((ostream *)&std::cout,in_RDI);
      std::operator<<(poVar11,"Boolean: ");
      (**(code **)(*(long *)in_RSI + 0x18))(local_220,in_RSI,0);
      poVar11 = operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      poVar11 = std::operator<<(poVar11," ");
      pcVar12 = anon_unknown_2::getAccessMode(in_stack_fffffffffffff588);
      std::operator<<(poVar11,pcVar12);
      GenICam_3_4::gcstring::~gcstring(local_220);
      if (in_RSI == (string *)0x0) {
        local_798 = (long *)0x0;
      }
      else {
        local_798 = (long *)__dynamic_cast(in_RSI,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
      }
      local_228 = local_798;
      bVar3 = GenApi_3_4::IsReadable(in_stack_fffffffffffff590);
      if (bVar3) {
        poVar11 = std::operator<<((ostream *)&std::cout,": ");
        bVar2 = (**(code **)(*local_228 + 0x48))(local_228,0);
        std::ostream::operator<<(poVar11,(bool)(bVar2 & 1));
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      break;
    case 4:
      poVar11 = std::operator<<((ostream *)&std::cout,in_RDI);
      std::operator<<(poVar11,"Command: ");
      (**(code **)(*(long *)in_RSI + 0x18))(local_278,in_RSI,0);
      poVar11 = operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      poVar11 = std::operator<<(poVar11," ");
      pcVar12 = anon_unknown_2::getAccessMode(in_stack_fffffffffffff588);
      poVar11 = std::operator<<(poVar11,pcVar12);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      GenICam_3_4::gcstring::~gcstring(local_278);
      break;
    case 5:
      poVar11 = std::operator<<((ostream *)&std::cout,in_RDI);
      std::operator<<(poVar11,"Float: ");
      (**(code **)(*(long *)in_RSI + 0x18))(local_2c8,in_RSI,0);
      poVar11 = operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      poVar11 = std::operator<<(poVar11," ");
      pcVar12 = anon_unknown_2::getAccessMode(in_stack_fffffffffffff588);
      poVar11 = std::operator<<(poVar11,pcVar12);
      std::operator<<(poVar11," ");
      GenICam_3_4::gcstring::~gcstring(local_2c8);
      if (in_RSI == (string *)0x0) {
        local_820 = (long *)0x0;
      }
      else {
        local_820 = (long *)__dynamic_cast(in_RSI,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IFloat::typeinfo,0xfffffffffffffffe);
      }
      local_2d0 = local_820;
      bVar3 = GenApi_3_4::IsReadable(in_stack_fffffffffffff590);
      if (bVar3) {
        poVar11 = std::operator<<((ostream *)&std::cout,"[");
        dVar13 = (double)(**(code **)(*local_2d0 + 0x60))();
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,dVar13);
        poVar11 = std::operator<<(poVar11,", ");
        dVar13 = (double)(**(code **)(*local_2d0 + 0x68))();
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,dVar13);
        poVar11 = std::operator<<(poVar11,"]: ");
        dVar13 = (double)(**(code **)(*local_2d0 + 0x48))(local_2d0,0);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,dVar13);
        std::operator<<(poVar11," ");
        (**(code **)(*local_2d0 + 0x98))();
        operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
        GenICam_3_4::gcstring::~gcstring(local_320);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      break;
    case 6:
      poVar11 = std::operator<<((ostream *)&std::cout,in_RDI);
      std::operator<<(poVar11,"String: ");
      (**(code **)(*(long *)in_RSI + 0x18))(local_370,in_RSI,0);
      poVar11 = operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      poVar11 = std::operator<<(poVar11," ");
      pcVar12 = anon_unknown_2::getAccessMode(in_stack_fffffffffffff588);
      poVar11 = std::operator<<(poVar11,pcVar12);
      std::operator<<(poVar11,": ");
      GenICam_3_4::gcstring::~gcstring(local_370);
      if (in_RSI == (string *)0x0) {
        local_898 = (long *)0x0;
      }
      else {
        local_898 = (long *)__dynamic_cast(in_RSI,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IString::typeinfo,0xfffffffffffffffe);
      }
      local_378 = local_898;
      bVar3 = GenApi_3_4::IsReadable(in_stack_fffffffffffff590);
      if (bVar3) {
        (**(code **)(*local_378 + 0x48))(local_3c8,local_378,0);
        operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
        GenICam_3_4::gcstring::~gcstring(local_3c8);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      break;
    case 7:
      if (in_RSI == (string *)0x0) {
        local_8c0 = (long *)0x0;
      }
      else {
        local_8c0 = (long *)__dynamic_cast(in_RSI,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
      }
      local_3d0 = local_8c0;
      if (local_8c0 != (long *)0x0) {
        local_3d4 = (**(code **)(*local_8c0 + 0x48))();
        poVar11 = std::operator<<((ostream *)&std::cout,in_RDI);
        std::operator<<(poVar11,"Register: ");
        (**(code **)(*(long *)in_RSI + 0x18))(local_428,in_RSI,0);
        poVar11 = operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
        poVar11 = std::operator<<(poVar11,"[");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_3d4);
        poVar11 = std::operator<<(poVar11,"] ");
        pcVar12 = anon_unknown_2::getAccessMode(in_stack_fffffffffffff588);
        poVar11 = std::operator<<(poVar11,pcVar12);
        poVar11 = std::operator<<(poVar11,": ");
        std::ostream::operator<<(poVar11,std::hex);
        GenICam_3_4::gcstring::~gcstring(local_428);
        bVar3 = GenApi_3_4::IsReadable(in_stack_fffffffffffff590);
        plVar10 = local_3d0;
        if (bVar3) {
          local_44c = 0x20;
          piVar6 = std::min<int>(&local_3d4,&local_44c);
          (**(code **)(*plVar10 + 0x40))(plVar10,local_448,(long)*piVar6,0);
          for (local_450 = 0; local_450 < local_3d4 && local_450 < 0x20; local_450 = local_450 + 1)
          {
            local_451 = (char)std::setfill<char>('0');
            poVar11 = std::operator<<(&std::cout,local_451);
            local_458 = (int)std::setw(2);
            poVar11 = std::operator<<(poVar11,(_Setw)local_458);
            std::ostream::operator<<(poVar11,(uint)local_448[local_450]);
          }
          if (0x20 < local_3d4) {
            std::operator<<((ostream *)&std::cout,"...");
          }
        }
        this = (void *)std::ostream::operator<<(&std::cout,std::dec);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      }
      break;
    case 8:
      poVar11 = std::operator<<((ostream *)&std::cout,in_RDI);
      std::operator<<(poVar11,"Category: ");
      (**(code **)(*(long *)in_RSI + 0x18))(local_4a8,in_RSI,0);
      poVar11 = operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      poVar11 = std::operator<<(poVar11," ");
      pcVar12 = anon_unknown_2::getAccessMode(in_stack_fffffffffffff588);
      poVar11 = std::operator<<(poVar11,pcVar12);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      GenICam_3_4::gcstring::~gcstring(local_4a8);
      if (0 < in_EDX) {
        if (in_RSI == (string *)0x0) {
          local_980 = (long *)0x0;
        }
        else {
          local_980 = (long *)__dynamic_cast(in_RSI,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::ICategory::typeinfo,0xfffffffffffffffe);
        }
        local_4b0 = local_980;
        if (local_980 != (long *)0x0) {
          GenApi_3_4::value_vector::value_vector(local_4c0);
          (**(code **)(*local_4b0 + 0x38))(local_4b0,local_4c0);
          for (local_4c8 = 0; uVar1 = local_4c8, uVar8 = GenApi_3_4::value_vector::size(),
              uVar1 < uVar8; local_4c8 = local_4c8 + 1) {
            std::operator+(in_stack_fffffffffffff5b8,(char *)in_stack_fffffffffffff5b0);
            puVar7 = (undefined8 *)GenApi_3_4::value_vector::operator[]((ulong)local_4c0);
            (**(code **)(*(long *)*puVar7 + 0x18))();
            printNode(in_RSI,(INode *)CONCAT44(in_EDX,uVar14),in_stack_ffffffffffffffe4,
                      (bool)in_stack_ffffffffffffffe3);
            std::__cxx11::string::~string(local_4e8);
          }
          GenApi_3_4::value_vector::~value_vector(local_4c0);
        }
      }
      break;
    case 9:
      poVar11 = std::operator<<((ostream *)&std::cout,in_RDI);
      std::operator<<(poVar11,"Enumeration: ");
      (**(code **)(*(long *)in_RSI + 0x18))(local_538,in_RSI,0);
      poVar11 = operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      poVar11 = std::operator<<(poVar11," ");
      pcVar12 = anon_unknown_2::getAccessMode(in_stack_fffffffffffff588);
      poVar11 = std::operator<<(poVar11,pcVar12);
      std::operator<<(poVar11,' ');
      GenICam_3_4::gcstring::~gcstring(local_538);
      if (in_RSI == (string *)0x0) {
        local_9e8 = (long *)0x0;
      }
      else {
        local_9e8 = (long *)__dynamic_cast(in_RSI,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
      }
      local_540 = local_9e8;
      if (local_9e8 != (long *)0x0) {
        std::operator<<((ostream *)&std::cout,'[');
        if ((uVar14 & 0x1000000) == 0) {
          std::operator<<((ostream *)&std::cout,"...");
        }
        else {
          GenICam_3_4::gcstring_vector::gcstring_vector(local_550);
          (**(code **)(*local_540 + 0x38))(local_540,local_550);
          for (local_558 = 0; uVar1 = local_558, uVar8 = GenICam_3_4::gcstring_vector::size(),
              uVar1 < uVar8; local_558 = local_558 + 1) {
            if (local_558 != 0) {
              std::operator<<((ostream *)&std::cout,' ');
            }
            GenICam_3_4::gcstring_vector::operator[]((ulong)local_550);
            operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
          }
          GenICam_3_4::gcstring_vector::~gcstring_vector(local_550);
        }
        std::operator<<((ostream *)&std::cout,"]: ");
        AccessMode = (*(code *)**(undefined8 **)((long)local_540 + *(long *)(*local_540 + -0x28)))
                               ((long)local_540 + *(long *)(*local_540 + -0x28));
        bVar3 = GenApi_3_4::IsReadable(AccessMode);
        if ((bVar3) && (lVar9 = (**(code **)(*local_540 + 0x78))(local_540,0), lVar9 != 0)) {
          plVar10 = (long *)(**(code **)(*local_540 + 0x78))(local_540,0);
          (**(code **)(*plVar10 + 0x40))();
          operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
          GenICam_3_4::gcstring::~gcstring(local_5a8);
        }
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      break;
    case 10:
      poVar11 = std::operator<<((ostream *)&std::cout,in_RDI);
      std::operator<<(poVar11,"EnumEntry: ");
      (**(code **)(*(long *)in_RSI + 0x18))(local_5f8,in_RSI,0);
      poVar11 = operator<<(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      poVar11 = std::operator<<(poVar11," ");
      pcVar12 = anon_unknown_2::getAccessMode(in_stack_fffffffffffff588);
      poVar11 = std::operator<<(poVar11,pcVar12);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      GenICam_3_4::gcstring::~gcstring(local_5f8);
      break;
    case 0xb:
      poVar11 = std::operator<<((ostream *)&std::cout,in_RDI);
      str = std::operator<<(poVar11,"Port: ");
      poVar11 = local_648;
      (**(code **)(*(long *)in_RSI + 0x18))(poVar11,in_RSI,0);
      poVar11 = operator<<(poVar11,(gcstring *)str);
      poVar11 = std::operator<<(poVar11," ");
      pcVar12 = anon_unknown_2::getAccessMode(in_stack_fffffffffffff588);
      poVar11 = std::operator<<(poVar11,pcVar12);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      GenICam_3_4::gcstring::~gcstring((gcstring *)local_648);
    }
  }
  return;
}

Assistant:

void printNode(const std::string &prefix, GenApi::INode *node, int depth, bool show_enum_list)
{
  if (node != 0 && node->GetAccessMode() != GenApi::NI)
  {
    switch (node->GetPrincipalInterfaceType())
    {
      case GenApi::intfIValue:
        std::cout << prefix << "Value: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      case GenApi::intfIBase:
        std::cout << prefix << "Base: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      case GenApi::intfIInteger:
        {
          std::cout << prefix << "Integer: " << node->GetName() << " "
                    << getAccessMode(node) << " ";

          GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(node);

          if (GenApi::IsReadable(p))
          {
            std::cout << "[" << formatValue(p, p->GetMin()) << ", "
                      << formatValue(p, p->GetMax()) << "]: ";
            std::cout << formatValue(p, p->GetValue()) << " " << p->GetUnit();
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfIBoolean:
        {
          std::cout << prefix << "Boolean: " << node->GetName() << " " << getAccessMode(node);

          GenApi::IBoolean *p=dynamic_cast<GenApi::IBoolean *>(node);

          if (GenApi::IsReadable(p))
          {
            std::cout << ": " << p->GetValue();
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfICommand:
        std::cout << prefix << "Command: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      case GenApi::intfIFloat:
        {
          std::cout << prefix << "Float: " << node->GetName() << " " << getAccessMode(node)
                    << " ";

          GenApi::IFloat *p=dynamic_cast<GenApi::IFloat *>(node);

          if (GenApi::IsReadable(p))
          {
            std::cout << "[" << p->GetMin() << ", "
                      << p->GetMax() << "]: "
                      << p->GetValue() << " " << p->GetUnit();
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfIString:
        {
          std::cout << prefix << "String: " << node->GetName() << " " << getAccessMode(node)
                    << ": ";

          GenApi::IString *p=dynamic_cast<GenApi::IString *>(node);

          if (GenApi::IsReadable(p))
          {
            std::cout << p->GetValue();
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfIRegister:
        {
          GenApi::IRegister *p=dynamic_cast<GenApi::IRegister *>(node);

          if (p)
          {
            int len=static_cast<int>(p->GetLength());

            std::cout << prefix << "Register: " << node->GetName() << "[" << len << "] "
              << getAccessMode(node) << ": " << std::hex;

            if (GenApi::IsReadable(p))
            {
              uint8_t buffer[32];
              p->Get(buffer, std::min(len, 32));

              for (int i=0; i<len && i<32; i++)
              {
                std::cout << std::setfill('0') << std::setw(2) << static_cast<int>(buffer[i]);
              }

              if (len > 32)
              {
                std::cout << "...";
              }
            }

            std::cout << std::dec << std::endl;
          }
        }

        break;

      case GenApi::intfICategory:
        {
          std::cout << prefix << "Category: " << node->GetName() << " "
                    << getAccessMode(node) << std::endl;

          if (depth > 0)
          {
            GenApi::ICategory *root=dynamic_cast<GenApi::ICategory *>(node);

            if (root != 0)
            {
              GenApi::FeatureList_t feature;
              root->GetFeatures(feature);

              for (size_t i=0; i<feature.size(); i++)
              {
                printNode(prefix+"  ", feature[i]->GetNode(), depth-1, show_enum_list);
              }
            }
          }
        }
        break;

      case GenApi::intfIEnumeration:
        {
          std::cout << prefix << "Enumeration: " << node->GetName() << " " << getAccessMode(node)
                    << ' ';

          GenApi::IEnumeration *p=dynamic_cast<GenApi::IEnumeration *>(node);

          if (p != nullptr)
          {
            std::cout << '[';

            if (show_enum_list)
            {
              GenApi::StringList_t list;
              p->GetSymbolics(list);

              for (size_t i=0; i<list.size(); i++)
              {
                if (i > 0)
                {
                  std::cout << ' ';
                }

                std::cout << list[i];
              }
            }
            else
            {
              std::cout << "...";
            }

            std::cout << "]: ";

            if (GenApi::IsReadable(p->GetAccessMode()) && p->GetCurrentEntry() != 0)
            {
              std::cout << p->GetCurrentEntry()->GetSymbolic();
            }
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfIEnumEntry:
        std::cout << prefix << "EnumEntry: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      case GenApi::intfIPort:
        std::cout << prefix << "Port: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      default:
        break;
    }
  }
}